

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTestRspFileFailure::Run(BuildTestRspFileFailure *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  Test *pTVar5;
  bool bVar6;
  int iVar7;
  Node *pNVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  string err;
  string local_78;
  string local_58;
  size_t local_38;
  
  iVar7 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule fail\n  command = fail\n  rspfile = $rspfile\n  rspfile_content = $long_command\nbuild out: fail in\n  rspfile = out.rsp\n  long_command = Another very long command\n"
              ,(ManifestParserOptions)0x0);
  if (iVar7 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"out","");
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  piVar1 = &(this->super_BuildTest).fs_.now_;
  *piVar1 = *piVar1 + 1;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in","");
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  VirtualFileSystem::Create(this_00,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  pTVar5 = g_current_test;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar3;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"out","");
  this_01 = &(this->super_BuildTest).builder_;
  pNVar8 = Builder::AddTarget(this_01,&local_78,&local_58);
  testing::Test::Check
            (pTVar5,pNVar8 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x794,"builder_.AddTarget(\"out\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = g_current_test;
  iVar7 = std::__cxx11::string::compare((char *)&local_58);
  bVar6 = testing::Test::Check
                    (pTVar5,iVar7 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x795,"\"\" == err");
  pTVar5 = g_current_test;
  if (bVar6) {
    local_38 = (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count;
    sVar4 = (this->super_BuildTest).fs_.files_created_._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    bVar6 = Builder::Build(this_01,&local_58);
    testing::Test::Check
              (pTVar5,!bVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x79a,"builder_.Build(&err)");
    pTVar5 = g_current_test;
    iVar7 = std::__cxx11::string::compare((char *)&local_58);
    bVar6 = testing::Test::Check
                      (pTVar5,iVar7 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x79b,"\"subcommand failed\" == err");
    if (((bVar6) &&
        (bVar6 = testing::Test::Check
                           (g_current_test,
                            (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                            ,0x79c,"1u == command_runner_.commands_ran_.size()"), bVar6)) &&
       (bVar6 = testing::Test::Check
                          (g_current_test,
                           sVar4 + 1 ==
                           (this->super_BuildTest).fs_.files_created_._M_t._M_impl.
                           super__Rb_tree_header._M_node_count,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x79f,"files_created + 1 == fs_.files_created_.size()"),
       pTVar5 = g_current_test, bVar6)) {
      local_78._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"out.rsp","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->super_BuildTest).fs_.files_created_._M_t,&local_78);
      bVar6 = testing::Test::Check
                        (pTVar5,(_Rb_tree_header *)cVar9._M_node !=
                                &(this->super_BuildTest).fs_.files_created_._M_t._M_impl.
                                 super__Rb_tree_header,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x7a0,"1u == fs_.files_created_.count(\"out.rsp\")");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar3) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((bVar6) &&
         (bVar6 = testing::Test::Check
                            (g_current_test,
                             local_38 ==
                             (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.
                             super__Rb_tree_header._M_node_count,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x7a3,"files_removed == fs_.files_removed_.size()"),
         pTVar5 = g_current_test, bVar6)) {
        local_78._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"out.rsp","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(this->super_BuildTest).fs_.files_removed_._M_t,&local_78);
        bVar6 = testing::Test::Check
                          (pTVar5,(_Rb_tree_header *)cVar9._M_node ==
                                  &(this->super_BuildTest).fs_.files_removed_._M_t._M_impl.
                                   super__Rb_tree_header,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x7a4,"0u == fs_.files_removed_.count(\"out.rsp\")");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar3) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = g_current_test;
        if (bVar6) {
          local_78._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"out.rsp","");
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
                    ::operator[](&(this->super_BuildTest).fs_.files_,&local_78);
          iVar7 = std::__cxx11::string::compare((char *)&pmVar10->contents);
          bVar6 = testing::Test::Check
                            (pTVar5,iVar7 == 0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x7a7,
                             "\"Another very long command\" == fs_.files_[\"out.rsp\"].contents");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar3) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) goto LAB_0013485b;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0013485b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTest, RspFileFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule fail\n"
    "  command = fail\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "build out: fail in\n"
    "  rspfile = out.rsp\n"
    "  long_command = Another very long command\n"));

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  size_t files_removed = fs_.files_removed_.size();

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ("subcommand failed", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  // The RSP file was created
  ASSERT_EQ(files_created + 1, fs_.files_created_.size());
  ASSERT_EQ(1u, fs_.files_created_.count("out.rsp"));

  // The RSP file was NOT removed
  ASSERT_EQ(files_removed, fs_.files_removed_.size());
  ASSERT_EQ(0u, fs_.files_removed_.count("out.rsp"));

  // The RSP file contains what it should
  ASSERT_EQ("Another very long command", fs_.files_["out.rsp"].contents);
}